

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ci.cpp
# Opt level: O2

void msd_ci<unsigned_short>(uchar **strings,size_t n,size_t depth)

{
  byte bVar1;
  ushort uVar2;
  uchar *puVar3;
  uint uVar4;
  void *__ptr;
  size_t i_1;
  long lVar5;
  uint uVar6;
  uchar *puVar7;
  byte bVar8;
  ulong uVar9;
  size_t i;
  size_t sVar10;
  ulong uVar11;
  size_t i_4;
  unsigned_short bucketsize [256];
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  memset(bucketsize,0,0x200);
  __ptr = malloc(n);
  for (sVar10 = 0; n != sVar10; sVar10 = sVar10 + 1) {
    *(uchar *)((long)__ptr + sVar10) = strings[sVar10][depth];
  }
  for (sVar10 = 0; n != sVar10; sVar10 = sVar10 + 1) {
    bucketsize[*(byte *)((long)__ptr + sVar10)] = bucketsize[*(byte *)((long)__ptr + sVar10)] + 1;
  }
  uVar6 = (uint)bucketsize[0];
  uVar11 = (ulong)bucketsize[0];
  uVar9 = uVar11;
  msd_ci<unsigned_short>::bucketindex[0] = uVar11;
  for (lVar5 = 1; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    uVar2 = bucketsize[lVar5];
    uVar9 = uVar9 + uVar2;
    msd_ci<unsigned_short>::bucketindex[lVar5] = uVar9;
    uVar4 = (uint)uVar2;
    if ((ulong)uVar2 == 0) {
      uVar4 = uVar6;
    }
    uVar6 = uVar4;
  }
  for (uVar9 = 0; uVar9 < n - uVar6; uVar9 = uVar9 + bucketsize[bVar8]) {
    puVar7 = strings[uVar9];
    bVar8 = *(byte *)((long)__ptr + uVar9);
    while( true ) {
      lVar5 = msd_ci<unsigned_short>::bucketindex[bVar8];
      msd_ci<unsigned_short>::bucketindex[bVar8] = lVar5 + -1;
      if (lVar5 + -1 <= (long)uVar9) break;
      puVar3 = strings[lVar5 + -1];
      bVar1 = *(byte *)((long)__ptr + lVar5 + -1);
      strings[lVar5 + -1] = puVar7;
      *(byte *)((long)__ptr + lVar5 + -1) = bVar8;
      puVar7 = puVar3;
      bVar8 = bVar1;
    }
    strings[uVar9] = puVar7;
  }
  free(__ptr);
  for (lVar5 = 1; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    uVar9 = (ulong)bucketsize[lVar5];
    if (uVar9 != 0) {
      msd_ci<unsigned_short>(strings + uVar11,uVar9,depth + 1);
      uVar11 = uVar11 + uVar9;
    }
  }
  return;
}

Assistant:

static void
msd_ci(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	BucketsizeType bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		oracle[i] = strings[i][depth];
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static ssize_t bucketindex[256];
	bucketindex[0] = bucketsize[0];
	BucketsizeType last_bucket_size = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		bucketindex[i] = bucketindex[i-1] + bucketsize[i];
		if (bucketsize[i]) last_bucket_size = bucketsize[i];
	}
	for (size_t i=0; i < n-last_bucket_size; ) {
		distblock<uint8_t> tmp = { strings[i], oracle[i] };
		while (1) {
			// Continue until the current bucket is completely in
			// place
			if (--bucketindex[tmp.bucket] <= ssize_t(i))
				break;
			// backup all information of the position we are about
			// to overwrite
			size_t backup_idx = bucketindex[tmp.bucket];
			distblock<uint8_t> tmp2 = { strings[backup_idx], oracle[backup_idx] };
			// overwrite everything, ie. move the string to correct
			// position
			strings[backup_idx] = tmp.ptr;
			oracle[backup_idx]  = tmp.bucket;
			tmp = tmp2;
		}
		// Commit last pointer to place. We don't need to copy the
		// oracle entry, it's not read after this.
		strings[i] = tmp.ptr;
		i += bucketsize[tmp.bucket];
	}
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_ci<BucketsizeType>(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}